

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int HashmapFindValue(jx9_hashmap *pMap,jx9_value *pNeedle,jx9_hashmap_node **ppNode,int bStrict)

{
  sxi32 sVar1;
  sxi32 iF2;
  sxi32 iF1;
  sxu32 n;
  sxi32 rc;
  jx9_value sNeedle;
  jx9_value *pVal;
  jx9_value sVal;
  jx9_hashmap_node *pEntry;
  int bStrict_local;
  jx9_hashmap_node **ppNode_local;
  jx9_value *pNeedle_local;
  jx9_hashmap *pMap_local;
  
  sVal._56_8_ = pMap->pFirst;
  iF2 = pMap->nEntry;
  jx9MemObjInit(pMap->pVm,(jx9_value *)&pVal);
  jx9MemObjInit(pMap->pVm,(jx9_value *)&n);
  do {
    if (iF2 == 0) {
      return -6;
    }
    sNeedle._56_8_ = HashmapExtractNodeValue((jx9_hashmap_node *)sVal._56_8_);
    if ((jx9_value *)sNeedle._56_8_ != (jx9_value *)0x0) {
      if (((((jx9_value *)sNeedle._56_8_)->iFlags | pNeedle->iFlags) & 0x20U) == 0) {
        jx9MemObjLoad((jx9_value *)sNeedle._56_8_,(jx9_value *)&pVal);
        jx9MemObjLoad(pNeedle,(jx9_value *)&n);
        sVar1 = jx9MemObjCmp((jx9_value *)&n,(jx9_value *)&pVal,bStrict,0);
        jx9MemObjRelease((jx9_value *)&pVal);
        jx9MemObjRelease((jx9_value *)&n);
        if (sVar1 == 0) {
          if (ppNode != (jx9_hashmap_node **)0x0) {
            *ppNode = (jx9_hashmap_node *)sVal._56_8_;
          }
          return 0;
        }
      }
      else if (((jx9_value *)sNeedle._56_8_)->iFlags == pNeedle->iFlags) {
        if (ppNode != (jx9_hashmap_node **)0x0) {
          *ppNode = (jx9_hashmap_node *)sVal._56_8_;
        }
        return 0;
      }
    }
    sVal._56_8_ = *(undefined8 *)(sVal._56_8_ + 0x48);
    iF2 = iF2 + -1;
  } while( true );
}

Assistant:

static int HashmapFindValue(
	jx9_hashmap *pMap,   /* Target hashmap */
	jx9_value *pNeedle,  /* Lookup key */
	jx9_hashmap_node **ppNode, /* OUT: target node on success  */
	int bStrict      /* TRUE for strict comparison */
	)
{
	jx9_hashmap_node *pEntry;
	jx9_value sVal, *pVal;
	jx9_value sNeedle;
	sxi32 rc;
	sxu32 n;
	/* Perform a linear search since we cannot sort the hashmap based on values */
	pEntry = pMap->pFirst;
	n = pMap->nEntry;
	jx9MemObjInit(pMap->pVm, &sVal);
	jx9MemObjInit(pMap->pVm, &sNeedle);
	for(;;){
		if( n < 1 ){
			break;
		}
		/* Extract node value */
		pVal = HashmapExtractNodeValue(pEntry);
		if( pVal ){
			if( (pVal->iFlags|pNeedle->iFlags) & MEMOBJ_NULL ){
				sxi32 iF1 = pVal->iFlags;
				sxi32 iF2 = pNeedle->iFlags;
				if( iF1 == iF2 ){
					/* NULL values are equals */
					if( ppNode ){
						*ppNode = pEntry;
					}
					return SXRET_OK;
				}
			}else{
				/* Duplicate value */
				jx9MemObjLoad(pVal, &sVal);
				jx9MemObjLoad(pNeedle, &sNeedle);
				rc = jx9MemObjCmp(&sNeedle, &sVal, bStrict, 0);
				jx9MemObjRelease(&sVal);
				jx9MemObjRelease(&sNeedle);
				if( rc == 0 ){
					if( ppNode ){
						*ppNode = pEntry;
					}
					/* Match found*/
					return SXRET_OK;
				}
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
		n--;
	}
	/* No such entry */
	return SXERR_NOTFOUND;
}